

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_SetAllocatedOneofMessageTest_Test::
TestBody(GeneratedMessageReflectionTest_SetAllocatedOneofMessageTest_Test *this)

{
  Message *pMVar1;
  Reflection *pRVar2;
  bool bVar3;
  Reflection *this_00;
  FieldDescriptor *pFVar4;
  char *pcVar5;
  char *in_R9;
  AssertHelper local_2e8;
  Message local_2e0;
  Message *local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2a0;
  Message local_298;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__3;
  string_view local_268;
  Message *local_258;
  Message *sub_message2;
  AssertHelper local_240;
  Message local_238;
  Message *local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1f8;
  Message local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__2;
  string_view local_1c0;
  Message *local_1b0;
  Message *sub_message;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__1;
  string local_150;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  Message *local_f8;
  Message *released;
  Reflection *reflection;
  Descriptor *descriptor;
  TestOneof2 to_message;
  undefined1 local_90 [8];
  TestOneof2 from_message2;
  TestOneof2 from_message1;
  GeneratedMessageReflectionTest_SetAllocatedOneofMessageTest_Test *this_local;
  
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)((long)&from_message2.field_0 + 0x28));
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)local_90);
  proto2_unittest::TestOneof2::TestOneof2((TestOneof2 *)&descriptor);
  reflection = (Reflection *)proto2_unittest::TestOneof2::descriptor();
  this_00 = proto2_unittest::TestOneof2::GetReflection();
  pRVar2 = reflection;
  released = (Message *)this_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "foo_lazy_message");
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,stack0xfffffffffffffef8);
  local_f8 = Reflection::ReleaseMessage(this_00,(Message *)&descriptor,pFVar4,(MessageFactory *)0x0)
  ;
  local_119 = local_f8 == (Message *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar3) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)local_118,(AssertionResult *)"released == nullptr","false",
               "true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4a2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  pRVar2 = reflection;
  pMVar1 = released;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__1.message_,"foo_message"
            );
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,stack0xfffffffffffffea0);
  local_f8 = Reflection::ReleaseMessage
                       ((Reflection *)pMVar1,(Message *)&descriptor,pFVar4,(MessageFactory *)0x0);
  local_171 = local_f8 == (Message *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar3) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&sub_message,(internal *)local_170,(AssertionResult *)"released == nullptr"
               ,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4a5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&sub_message);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  TestUtil::ReflectionTester::SetOneofViaReflection
            ((Message *)((long)&from_message2.field_0 + 0x28));
  TestUtil::ReflectionTester::ExpectOneofSetViaReflection
            ((Message *)((long)&from_message2.field_0 + 0x28));
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            ((Message *)((long)&from_message2.field_0 + 0x28),(Message *)&descriptor);
  pRVar2 = reflection;
  pMVar1 = released;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1c0,"foo_lazy_message");
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,local_1c0);
  local_1b0 = Reflection::GetMessage
                        ((Reflection *)pMVar1,(Message *)&descriptor,pFVar4,(MessageFactory *)0x0);
  pRVar2 = reflection;
  pMVar1 = released;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__2.message_,
             "foo_lazy_message");
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,stack0xfffffffffffffe30);
  local_f8 = Reflection::ReleaseMessage
                       ((Reflection *)pMVar1,(Message *)&descriptor,pFVar4,(MessageFactory *)0x0);
  local_1e1 = local_f8 != (Message *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar3) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_1e0,
               (AssertionResult *)"released != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4b2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_230 = local_1b0;
  testing::internal::EqHelper::
  Compare<const_google::protobuf::Message_*,_google::protobuf::Message_*,_nullptr>
            ((EqHelper *)local_228,"&sub_message","released",&local_230,&local_f8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar3) {
    testing::Message::Message(&local_238);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4b4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  if (local_f8 != (Message *)0x0) {
    (*(local_f8->super_MessageLite)._vptr_MessageLite[1])();
  }
  TestUtil::ReflectionTester::SetOneofViaReflection((Message *)local_90);
  pRVar2 = reflection;
  pMVar1 = released;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&sub_message2,"foo_message");
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,_sub_message2);
  Reflection::MutableMessage((Reflection *)pMVar1,(Message *)local_90,pFVar4,(MessageFactory *)0x0);
  TestUtil::ReflectionTester::SetAllocatedOptionalMessageFieldsToMessageViaReflection
            ((Message *)local_90,(Message *)&descriptor);
  pRVar2 = reflection;
  pMVar1 = released;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"foo_message")
  ;
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,local_268);
  local_258 = Reflection::GetMessage
                        ((Reflection *)pMVar1,(Message *)&descriptor,pFVar4,(MessageFactory *)0x0);
  pRVar2 = reflection;
  pMVar1 = released;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar__3.message_,"foo_message"
            );
  pFVar4 = Descriptor::FindFieldByName((Descriptor *)pRVar2,stack0xfffffffffffffd88);
  local_f8 = Reflection::ReleaseMessage
                       ((Reflection *)pMVar1,(Message *)&descriptor,pFVar4,(MessageFactory *)0x0);
  local_289 = local_f8 != (Message *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar3) {
    testing::Message::Message(&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_288,
               (AssertionResult *)"released != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4c6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  local_2d8 = local_258;
  testing::internal::EqHelper::
  Compare<const_google::protobuf::Message_*,_google::protobuf::Message_*,_nullptr>
            ((EqHelper *)local_2d0,"&sub_message2","released",&local_2d8,&local_f8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar3) {
    testing::Message::Message(&local_2e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x4c8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  if (local_f8 != (Message *)0x0) {
    (*(local_f8->super_MessageLite)._vptr_MessageLite[1])();
  }
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)&descriptor);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)local_90);
  proto2_unittest::TestOneof2::~TestOneof2((TestOneof2 *)((long)&from_message2.field_0 + 0x28));
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, SetAllocatedOneofMessageTest) {
  unittest::TestOneof2 from_message1;
  unittest::TestOneof2 from_message2;
  unittest::TestOneof2 to_message;
  const Descriptor* descriptor = unittest::TestOneof2::descriptor();
  const Reflection* reflection = to_message.GetReflection();

  Message* released = reflection->ReleaseMessage(
      &to_message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_TRUE(released == nullptr);
  released = reflection->ReleaseMessage(
      &to_message, descriptor->FindFieldByName("foo_message"));
  EXPECT_TRUE(released == nullptr);

  TestUtil::ReflectionTester::SetOneofViaReflection(&from_message1);
  TestUtil::ReflectionTester::ExpectOneofSetViaReflection(from_message1);

  TestUtil::ReflectionTester::
      SetAllocatedOptionalMessageFieldsToMessageViaReflection(&from_message1,
                                                              &to_message);
  const Message& sub_message = reflection->GetMessage(
      to_message, descriptor->FindFieldByName("foo_lazy_message"));
  (void)sub_message;  // unused in somce configurations
  released = reflection->ReleaseMessage(
      &to_message, descriptor->FindFieldByName("foo_lazy_message"));
  EXPECT_TRUE(released != nullptr);
  if (!internal::DebugHardenForceCopyInRelease()) {
    EXPECT_EQ(&sub_message, released);
  }
  delete released;

  TestUtil::ReflectionTester::SetOneofViaReflection(&from_message2);

  reflection->MutableMessage(&from_message2,
                             descriptor->FindFieldByName("foo_message"));

  TestUtil::ReflectionTester::
      SetAllocatedOptionalMessageFieldsToMessageViaReflection(&from_message2,
                                                              &to_message);

  const Message& sub_message2 = reflection->GetMessage(
      to_message, descriptor->FindFieldByName("foo_message"));
  (void)sub_message2;  // unused in somce configurations
  released = reflection->ReleaseMessage(
      &to_message, descriptor->FindFieldByName("foo_message"));
  EXPECT_TRUE(released != nullptr);
  if (!internal::DebugHardenForceCopyInRelease()) {
    EXPECT_EQ(&sub_message2, released);
  }
  delete released;
}